

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O2

bool Rml::InterpolateEffectProperties
               (PropertyDictionary *properties,EffectDeclarationView *d0,EffectDeclarationView *d1,
               float alpha,Element *element)

{
  PropertyId id_00;
  EffectSpecification *pEVar1;
  NodePtr pDVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  PropertyMap *pPVar7;
  PropertyMap *this;
  PropertySpecification *this_00;
  PropertyDefinition *this_01;
  Property *pPVar8;
  EffectDeclarationView *pEVar9;
  Property *p0;
  EffectSpecification *this_02;
  pair<Rml::PropertyId,_Rml::Property> *pair_filled;
  NodePtr pDVar10;
  Property *p1;
  const_iterator cVar11;
  PropertyId id;
  const_iterator __begin2;
  Property p;
  PropertyId local_b5;
  float local_b4;
  PropertyDictionary *local_b0;
  Element *local_a8;
  const_iterator local_a0;
  EffectDeclarationView *local_90;
  EffectDeclarationView *local_88;
  Property local_80;
  
  this_02 = d0->instancer;
  pEVar1 = d1->instancer;
  local_b4 = alpha;
  local_b0 = properties;
  local_a8 = element;
  if (this_02 == (EffectSpecification *)0x0) {
    pEVar9 = d1;
    this_02 = pEVar1;
    if (pEVar1 == (EffectSpecification *)0x0) {
      return false;
    }
  }
  else {
    pEVar9 = d0;
    if (pEVar1 != (EffectSpecification *)0x0) {
      if ((this_02 != pEVar1) || (bVar4 = ::std::operator!=(d0->type,d1->type), bVar4)) {
        return false;
      }
      iVar5 = PropertyDictionary::GetNumProperties(d0->properties);
      iVar6 = PropertyDictionary::GetNumProperties(d1->properties);
      if (iVar5 != iVar6) {
        return false;
      }
      if (d0->paint_area == d1->paint_area) {
        pPVar7 = PropertyDictionary::GetProperties(d0->properties);
        this = PropertyDictionary::GetProperties(d1->properties);
        local_a0 = robin_hood::detail::
                   Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   ::cbegin(pPVar7);
        pDVar2 = (NodePtr)pPVar7->mInfo;
        pDVar10 = local_a0.mKeyVals;
        while( true ) {
          if (pDVar10 == pDVar2) {
            return true;
          }
          local_b5 = (pDVar10->mData).first;
          cVar11 = robin_hood::detail::
                   Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   ::find(this,&local_b5);
          if (cVar11.mKeyVals == (NodePtr)this->mInfo) break;
          InterpolateProperties
                    (&local_80,&(pDVar10->mData).second,&((cVar11.mKeyVals)->mData).second,local_b4,
                     local_a8,(pDVar10->mData).second.definition);
          local_80.definition = (pDVar10->mData).second.definition;
          PropertyDictionary::SetProperty(local_b0,local_b5,&local_80);
          Property::~Property(&local_80);
          robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::Iter<true>::operator++(&local_a0);
          pDVar10 = local_a0.mKeyVals;
        }
        bVar4 = Assert("Incompatible decorator properties.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                       ,0x9a);
        if (bVar4) {
          return false;
        }
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      return false;
    }
  }
  local_90 = d0;
  local_88 = d1;
  this_00 = EffectSpecification::GetPropertySpecification(this_02);
  pPVar7 = PropertyDictionary::GetProperties(pEVar9->properties);
  local_a0 = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::cbegin(pPVar7);
  pDVar2 = (NodePtr)pPVar7->mInfo;
  pDVar10 = local_a0.mKeyVals;
  while( true ) {
    if (pDVar10 == pDVar2) {
      return true;
    }
    id_00 = (pDVar10->mData).first;
    this_01 = PropertySpecification::GetProperty(this_00,id_00);
    if (this_01 == (PropertyDefinition *)0x0) break;
    p1 = &(pDVar10->mData).second;
    pPVar8 = PropertyDefinition::GetDefaultValue(this_01);
    p0 = p1;
    if (local_90->instancer == (EffectSpecification *)0x0) {
      p0 = pPVar8;
    }
    if (local_88->instancer == (EffectSpecification *)0x0) {
      p1 = pPVar8;
    }
    InterpolateProperties(&local_80,p0,p1,local_b4,local_a8,(pDVar10->mData).second.definition);
    local_80.definition = (pDVar10->mData).second.definition;
    PropertyDictionary::SetProperty(local_b0,id_00,&local_80);
    Property::~Property(&local_80);
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++(&local_a0);
    pDVar10 = local_a0.mKeyVals;
  }
  return false;
}

Assistant:

static bool InterpolateEffectProperties(PropertyDictionary& properties, const EffectDeclarationView& d0, const EffectDeclarationView& d1, float alpha,
	Element& element)
{
	if (d0 && d1)
	{
		// Both declarations are specified, check if they are compatible for interpolation.
		if (!d0.instancer || d0.instancer != d1.instancer || *d0.type != *d1.type ||
			d0.properties->GetNumProperties() != d1.properties->GetNumProperties() || d0.paint_area != d1.paint_area)
			return false;

		const auto& properties0 = d0.properties->GetProperties();
		const auto& properties1 = d1.properties->GetProperties();

		for (const auto& pair0 : properties0)
		{
			const PropertyId id = pair0.first;
			const Property& prop0 = pair0.second;

			auto it = properties1.find(id);
			if (it == properties1.end())
			{
				RMLUI_ERRORMSG("Incompatible decorator properties.");
				return false;
			}
			const Property& prop1 = it->second;

			Property p = InterpolateProperties(prop0, prop1, alpha, element, prop0.definition);
			p.definition = prop0.definition;
			properties.SetProperty(id, p);
		}
		return true;
	}
	else if ((d0 && !d1) || (!d0 && d1))
	{
		// One of the declarations is empty, interpolate against the default values of its type.
		const auto& d_filled = (d0 ? d0 : d1);

		const PropertySpecification& specification = d_filled.instancer->GetPropertySpecification();
		const PropertyMap& properties_filled = d_filled.properties->GetProperties();

		for (const auto& pair_filled : properties_filled)
		{
			const PropertyId id = pair_filled.first;
			const PropertyDefinition* underlying_definition = specification.GetProperty(id);
			if (!underlying_definition)
				return false;

			const Property& p_filled = pair_filled.second;
			const Property& p_default = *underlying_definition->GetDefaultValue();
			const Property& p_interp0 = (d0 ? p_filled : p_default);
			const Property& p_interp1 = (d1 ? p_filled : p_default);

			Property p = InterpolateProperties(p_interp0, p_interp1, alpha, element, p_filled.definition);
			p.definition = p_filled.definition;
			properties.SetProperty(id, p);
		}
		return true;
	}

	return false;
}